

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ogf_v3.cxx
# Opt level: O2

uint16_t __thiscall xray_re::xr_ogf_v3::motion_io::import_params(motion_io *this,xr_reader *r)

{
  uint *puVar1;
  uint16_t uVar2;
  uint8_t *puVar3;
  uint16_t *puVar4;
  float *pfVar5;
  
  xr_reader::r_sz(r,&(this->super_xr_skl_motion).super_xr_motion.m_name);
  puVar3 = (r->field_2).m_p;
  (r->field_2).m_p = puVar3 + 1;
  (this->super_xr_skl_motion).m_flags = (uint)(*puVar3 == '\0');
  puVar4 = (r->field_2).m_p_u16;
  (r->field_2).m_p = (uint8_t *)(puVar4 + 1);
  (this->super_xr_skl_motion).m_bone_or_part = *puVar4;
  puVar4 = (r->field_2).m_p_u16;
  (r->field_2).m_p = (uint8_t *)(puVar4 + 1);
  uVar2 = *puVar4;
  (r->field_2).m_p = (uint8_t *)(puVar4 + 3);
  (this->super_xr_skl_motion).m_speed = *(float *)(puVar4 + 1);
  pfVar5 = (float *)(r->field_2).m_p_u32;
  (r->field_2).m_p = (uint8_t *)(pfVar5 + 1);
  (this->super_xr_skl_motion).m_power = *pfVar5;
  pfVar5 = (float *)(r->field_2).m_p_u32;
  (r->field_2).m_p = (uint8_t *)(pfVar5 + 1);
  (this->super_xr_skl_motion).m_accrue = *pfVar5;
  pfVar5 = (float *)(r->field_2).m_p_u32;
  (r->field_2).m_p = (uint8_t *)(pfVar5 + 1);
  (this->super_xr_skl_motion).m_falloff = *pfVar5;
  puVar3 = (r->field_2).m_p;
  (r->field_2).m_p = puVar3 + 1;
  if (*puVar3 != '\0') {
    puVar1 = &(this->super_xr_skl_motion).m_flags;
    *(byte *)puVar1 = (byte)*puVar1 | 2;
  }
  return uVar2;
}

Assistant:

inline uint16_t xr_ogf_v3::motion_io::import_params(xr_reader& r)
{
	r.r_sz(m_name);
	m_flags = (r.r_u8() == SMT_FX) ? SMF_FX : 0;
	m_bone_or_part = r.r_u16();
	uint16_t motion_id = r.r_u16();
	m_speed = r.r_float();
	m_power = r.r_float();
	m_accrue = r.r_float();
	m_falloff = r.r_float();
	if (r.r_bool())
		m_flags |= SMF_STOP_AT_END;
	return motion_id;
}